

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  u8 uVar1;
  Vdbe *p;
  ExprList *pEVar2;
  byte bVar3;
  int iVar4;
  int p1;
  int iVar5;
  int iVar6;
  int iVar7;
  Select *pSVar8;
  int *aiMap;
  Expr *p_00;
  Expr *pEVar9;
  CollSeq *zP4;
  u8 uVar10;
  Op *pOVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  ExprList_item *pEVar17;
  uint uVar18;
  int iTab;
  int rRhsHasNull;
  int regToFree;
  int iDummy;
  int local_6c;
  Expr *local_68;
  int local_5c;
  Parse *local_58;
  Expr *local_50;
  int local_48;
  int local_44;
  byte *local_40;
  int local_38;
  int local_34;
  
  local_44 = 0;
  local_6c = 0;
  uVar1 = pParse->okConstFactor;
  pEVar9 = pExpr->pLeft;
  iVar4 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar4 != 0) {
    return;
  }
  local_40 = (byte *)exprINAffinity(pParse,pExpr);
  pSVar8 = (Select *)pExpr->pLeft;
  uVar10 = pSVar8->op;
  if (uVar10 == 0xb0) {
    uVar10 = *(u8 *)&pSVar8->nSelectRow;
  }
  if (uVar10 == 0xb1) {
LAB_0018743c:
    uVar13 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar8->pEList)->pList->nExpr;
  }
  else {
    uVar13 = 1;
    if (uVar10 == 0x8a) {
      pSVar8 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar8->pEList)->pSelect;
      goto LAB_0018743c;
    }
  }
  local_50 = pEVar9;
  aiMap = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar13 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_00187465;
  piVar16 = (int *)(ulong)uVar13;
  p = pParse->pVdbe;
  piVar15 = &local_44;
  if (destIfFalse == destIfNull) {
    piVar15 = (int *)0x0;
  }
  local_68 = pExpr;
  iVar4 = sqlite3FindInIndex(pParse,pExpr,3,piVar15,aiMap,&local_6c);
  pParse->okConstFactor = '\0';
  local_5c = exprCodeVector(pParse,local_50,&local_34);
  pEVar9 = local_68;
  pParse->okConstFactor = uVar1;
  piVar15 = (int *)0x0;
  if (0 < (int)uVar13) {
    piVar14 = (int *)0x0;
    do {
      piVar15 = piVar14;
      if (piVar14 != (int *)(ulong)(uint)aiMap[(long)piVar14]) break;
      piVar14 = (int *)((long)piVar14 + 1);
      piVar15 = piVar16;
    } while (piVar16 != piVar14);
  }
  p1 = local_5c;
  if (((uint)piVar15 != uVar13) &&
     (p1 = sqlite3GetTempRange(pParse,uVar13), iVar5 = local_5c, 0 < (int)uVar13)) {
    piVar15 = (int *)0x0;
    local_58 = pParse;
    do {
      sqlite3VdbeAddOp3(p,0x50,iVar5 + (int)piVar15,aiMap[(long)piVar15] + p1,0);
      piVar15 = (int *)((long)piVar15 + 1);
      pParse = local_58;
      pEVar9 = local_68;
    } while (piVar16 != piVar15);
  }
  if (iVar4 == 5) {
    iVar5 = pParse->nLabel + -1;
    pParse->nLabel = iVar5;
    pEVar2 = (pEVar9->x).pList;
    local_50 = (Expr *)sqlite3ExprCollSeq(pParse,pEVar9->pLeft);
    iVar4 = 0;
    if (destIfFalse != destIfNull) {
      if (pParse->nTempReg == '\0') {
        iVar4 = pParse->nMem + 1;
        pParse->nMem = iVar4;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar4 = pParse->aTempReg[bVar3];
      }
      sqlite3VdbeAddOp3(p,0x66,p1,p1,iVar4);
    }
    if (0 < pEVar2->nExpr) {
      pEVar17 = pEVar2->a;
      lVar12 = 0;
      do {
        iVar6 = sqlite3ExprCodeTemp(pParse,pEVar17->pExpr,&local_38);
        if ((iVar4 != 0) && (iVar7 = sqlite3ExprCanBeNull(pEVar17->pExpr), iVar7 != 0)) {
          sqlite3VdbeAddOp3(p,0x66,iVar4,iVar6,iVar4);
        }
        if (local_38 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = local_38;
          }
        }
        if ((destIfFalse == destIfNull) && ((long)pEVar2->nExpr + -1 <= lVar12)) {
          iVar6 = sqlite3VdbeAddOp3(p,(p1 != iVar6) + 0x32 + (uint)(p1 != iVar6),p1,destIfFalse,
                                    iVar6);
          sqlite3VdbeChangeP4(p,iVar6,(char *)local_50,-2);
          uVar13 = p->nOp;
          if (0 < (int)uVar13) {
            bVar3 = *local_40 | 0x10;
LAB_00187a4e:
            p->aOp[(ulong)uVar13 - 1].p5 = (short)(char)bVar3;
          }
        }
        else {
          iVar6 = sqlite3VdbeAddOp3(p,(p1 != iVar6) + 0x33 + (uint)(p1 != iVar6),p1,iVar5,iVar6);
          sqlite3VdbeChangeP4(p,iVar6,(char *)local_50,-2);
          uVar13 = p->nOp;
          if (0 < (int)uVar13) {
            bVar3 = *local_40;
            goto LAB_00187a4e;
          }
        }
        lVar12 = lVar12 + 1;
        pEVar17 = pEVar17 + 1;
      } while (lVar12 < pEVar2->nExpr);
    }
    if (iVar4 == 0) {
      sqlite3VdbeResolveLabel(p,iVar5);
    }
    else {
      sqlite3VdbeAddOp3(p,0x32,iVar4,destIfNull,0);
      sqlite3VdbeAddOp3(p,9,0,destIfFalse,0);
      sqlite3VdbeResolveLabel(p,iVar5);
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar4;
      }
    }
  }
  else {
    iVar6 = 0;
    iVar5 = destIfFalse;
    if (destIfFalse != destIfNull) {
      iVar6 = pParse->nLabel + -1;
      pParse->nLabel = iVar6;
      iVar5 = iVar6;
    }
    local_68 = (Expr *)CONCAT44(local_68._4_4_,iVar5);
    local_58 = (Parse *)CONCAT44(local_58._4_4_,iVar6);
    if (0 < (int)uVar13) {
      uVar18 = 0;
      do {
        if (pParse->nErr != 0) goto LAB_00187465;
        p_00 = sqlite3VectorFieldSubexpr(pEVar9->pLeft,uVar18);
        iVar5 = sqlite3ExprCanBeNull(p_00);
        if (iVar5 != 0) {
          sqlite3VdbeAddOp3(p,0x32,p1 + uVar18,(int)local_68,0);
        }
        uVar18 = uVar18 + 1;
      } while (uVar13 != uVar18);
    }
    if (iVar4 == 1) {
      sqlite3VdbeAddOp3(p,0x1e,local_6c,destIfFalse,p1);
      local_48 = sqlite3VdbeAddOp3(p,9,0,0,0);
    }
    else {
      iVar4 = sqlite3VdbeAddOp3(p,0x60,p1,uVar13,0);
      sqlite3VdbeChangeP4(p,iVar4,(char *)local_40,uVar13);
      if (destIfFalse == destIfNull) {
        iVar4 = sqlite3VdbeAddOp3(p,0x1c,local_6c,destIfFalse,p1);
        if (p->db->mallocFailed == '\0') {
          pOVar11 = p->aOp;
          pOVar11[iVar4].p4type = -3;
          pOVar11[iVar4].p4.i = uVar13;
        }
        goto LAB_00187b07;
      }
      local_48 = sqlite3VdbeAddOp3(p,0x1d,local_6c,0,p1);
      if (p->db->mallocFailed == '\0') {
        pOVar11 = p->aOp;
        pOVar11[local_48].p4type = -3;
        pOVar11[local_48].p4.i = uVar13;
      }
    }
    iVar4 = (int)local_58;
    if (uVar13 == 1 && local_44 != 0) {
      sqlite3VdbeAddOp3(p,0x33,local_44,destIfFalse,0);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeAddOp3(p,9,0,destIfFalse,0);
    }
    if (iVar4 != 0) {
      sqlite3VdbeResolveLabel(p,iVar4);
    }
    local_68 = (Expr *)CONCAT44(local_68._4_4_,local_6c);
    iVar5 = sqlite3VdbeAddOp3(p,0x24,local_6c,destIfFalse,0);
    iVar4 = destIfFalse;
    if (1 < (int)uVar13) {
      iVar4 = pParse->nLabel + -1;
      pParse->nLabel = iVar4;
    }
    if (0 < (int)uVar13) {
      uVar18 = 0;
      do {
        if (pParse->nTempReg == '\0') {
          iVar6 = pParse->nMem + 1;
          pParse->nMem = iVar6;
        }
        else {
          bVar3 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar3;
          iVar6 = pParse->aTempReg[bVar3];
        }
        pEVar9 = sqlite3VectorFieldSubexpr(local_50,uVar18);
        zP4 = sqlite3ExprCollSeq(pParse,pEVar9);
        sqlite3VdbeAddOp3(p,0x5e,(int)local_68,uVar18,iVar6);
        iVar7 = sqlite3VdbeAddOp3(p,0x34,p1 + uVar18,iVar4,iVar6);
        sqlite3VdbeChangeP4(p,iVar7,(char *)zP4,-2);
        if (iVar6 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = iVar6;
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar13 != uVar18);
    }
    sqlite3VdbeAddOp3(p,9,0,destIfNull,0);
    if (1 < (int)uVar13) {
      sqlite3VdbeResolveLabel(p,iVar4);
      sqlite3VdbeAddOp3(p,0x27,(int)local_68,iVar5 + 1,0);
      sqlite3VdbeAddOp3(p,9,0,destIfFalse,0);
    }
    if (p->db->mallocFailed == '\0') {
      pOVar11 = p->aOp + local_48;
    }
    else {
      pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar11->p2 = p->nOp;
  }
LAB_00187b07:
  if (p1 != 0 && p1 != local_5c) {
    bVar3 = pParse->nTempReg;
    if ((ulong)bVar3 < 8) {
      pParse->nTempReg = bVar3 + 1;
      pParse->aTempReg[bVar3] = p1;
    }
  }
LAB_00187465:
  if (aiMap != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,aiMap);
  }
  if (local_40 != (byte *)0x0) {
    sqlite3DbFreeNN(pParse->db,local_40);
  }
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */
  int iTab = 0;         /* Index to use */
  u8 okConstFactor = pParse->okConstFactor;

  assert( !ExprHasVVAProperty(pExpr,EP_Immutable) );
  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened with cursor iTab
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull,
                             aiMap, &iTab);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a
  ** vector, then it is stored in an array of nVector registers starting
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  **
  ** Avoid factoring the LHS of the IN(...) expression out of the loop,
  ** even if it is constant, as OP_Affinity may be used on the register
  ** by code generated below.  */
  assert( pParse->okConstFactor==okConstFactor );
  pParse->okConstFactor = 0;
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  pParse->okConstFactor = okConstFactor;
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList;
    CollSeq *pColl;
    int labelOk = sqlite3VdbeMakeLabel(pParse);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( ExprUseXList(pExpr) );
    pList = pExpr->x.pList;
    pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        int op = rLhs!=r2 ? OP_Eq : OP_NotNull;
        sqlite3VdbeAddOp4(v, op, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1 && op==OP_Eq);
        VdbeCoverageIf(v, ii==pList->nExpr-1 && op==OP_Eq);
        VdbeCoverageIf(v, ii<pList->nExpr-1 && op==OP_NotNull);
        VdbeCoverageIf(v, ii==pList->nExpr-1 && op==OP_NotNull);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        int op = rLhs!=r2 ? OP_Ne : OP_IsNull;
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, op, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, op==OP_Ne);
        VdbeCoverageIf(v, op==OP_IsNull);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(pParse);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( pParse->nErr ) goto sqlite3ExprCodeIN_oom_error;
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, iTab, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, iTab, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, iTab, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false.
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(pParse);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}